

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

int soplex::
    SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (Breakpoint *keys,BreakpointCompare *compare,int start,int end,int size,int start2,
              int end2,bool type)

{
  Breakpoint *pBVar1;
  Breakpoint *pBVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  BreakpointSource BVar6;
  int iVar7;
  BreakpointSource BVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  Breakpoint *pBVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Breakpoint tmp;
  
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar3 = end - 1;
  if ((int)uVar3 <= start2 + size) {
    SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (keys,end,compare,start2,type);
    return uVar3;
  }
  iVar11 = (int)(start2 + uVar3) / 2;
  pBVar1 = keys + iVar11;
  dVar4 = keys[iVar11].val;
  lVar16 = (long)(int)uVar3;
  lVar15 = (long)start2;
  uVar9 = uVar3;
  uVar13 = start2;
  do {
    uVar10 = (ulong)uVar9;
    uVar14 = uVar13;
    if (type) {
      if ((int)uVar13 < (int)uVar3) {
        pBVar12 = keys + (int)uVar13;
        lVar17 = 0;
        do {
          if (dVar4 < pBVar12->val || dVar4 == pBVar12->val) {
            uVar14 = uVar13 - (int)lVar17;
            break;
          }
          lVar17 = lVar17 + -1;
          pBVar12 = pBVar12 + 1;
          uVar14 = uVar3;
        } while (-lVar16 + (long)(int)uVar13 != lVar17);
      }
      if (start2 < (int)uVar9) {
        uVar10 = (ulong)(int)uVar9;
        pBVar12 = keys + uVar10;
        do {
          dVar5 = pBVar12->val;
          if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (dVar5 - dVar4 < 0.0))
          goto LAB_0023cb02;
          uVar10 = uVar10 - 1;
          pBVar12 = pBVar12 + -1;
        } while (lVar15 < (long)uVar10);
LAB_0023caff:
        uVar10 = (ulong)(uint)start2;
      }
    }
    else {
      if ((int)uVar13 < (int)uVar3) {
        pBVar12 = keys + (int)uVar13;
        lVar17 = 0;
        do {
          dVar5 = pBVar12->val;
          if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (0.0 < dVar5 - dVar4)) {
            uVar14 = uVar13 - (int)lVar17;
            break;
          }
          lVar17 = lVar17 + -1;
          pBVar12 = pBVar12 + 1;
          uVar14 = uVar3;
        } while (-lVar16 + (long)(int)uVar13 != lVar17);
      }
      if (start2 < (int)uVar9) {
        uVar10 = (ulong)(int)uVar9;
        pBVar12 = keys + uVar10;
        do {
          if (pBVar12->val <= dVar4) goto LAB_0023cb02;
          uVar10 = uVar10 - 1;
          pBVar12 = pBVar12 + -1;
        } while (lVar15 < (long)uVar10);
        goto LAB_0023caff;
      }
    }
LAB_0023cb02:
    uVar9 = (uint)uVar10;
    if ((int)uVar9 <= (int)uVar14) break;
    pBVar12 = keys + (int)uVar14;
    dVar5 = pBVar12->val;
    iVar7 = pBVar12->idx;
    BVar8 = pBVar12->src;
    pBVar12 = keys + (int)uVar9;
    iVar11 = pBVar12->idx;
    BVar6 = pBVar12->src;
    pBVar2 = keys + (int)uVar14;
    pBVar2->val = pBVar12->val;
    pBVar2->idx = iVar11;
    pBVar2->src = BVar6;
    pBVar12 = keys + (int)uVar9;
    pBVar12->val = dVar5;
    pBVar12->idx = iVar7;
    pBVar12->src = BVar8;
    uVar13 = uVar14 + 1;
    uVar9 = uVar9 - 1;
  } while( true );
  if (type) {
    if ((int)uVar14 < (int)uVar3) {
      pBVar12 = keys + (int)uVar14;
      uVar13 = uVar14;
      do {
        dVar5 = pBVar12->val;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) &&
           (uVar14 = uVar13, dVar4 - dVar5 < 0.0)) break;
        uVar13 = uVar13 + 1;
        pBVar12 = pBVar12 + 1;
        uVar14 = uVar3;
      } while (uVar3 != uVar13);
    }
    if (uVar14 == start2) {
      pBVar12 = keys + lVar15;
      dVar4 = pBVar12->val;
      iVar7 = pBVar12->idx;
      BVar8 = pBVar12->src;
      iVar11 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar12 = keys + lVar15;
      pBVar12->val = pBVar1->val;
      pBVar12->idx = iVar11;
      pBVar12->src = BVar6;
      pBVar1->val = dVar4;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar14 = start2 + 1;
    }
  }
  else {
    if (start2 < (int)uVar9) {
      uVar10 = (ulong)(int)uVar9;
      pBVar12 = keys + uVar10;
      do {
        dVar5 = pBVar12->val;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (0.0 < dVar4 - dVar5))
        goto LAB_0023cc0c;
        uVar10 = uVar10 - 1;
        pBVar12 = pBVar12 + -1;
      } while (lVar15 < (long)uVar10);
      uVar10 = (ulong)(uint)start2;
    }
LAB_0023cc0c:
    uVar9 = (uint)uVar10;
    if (uVar9 == uVar3) {
      pBVar12 = keys + lVar16;
      dVar4 = pBVar12->val;
      iVar7 = pBVar12->idx;
      BVar8 = pBVar12->src;
      iVar11 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar12 = keys + lVar16;
      pBVar12->val = pBVar1->val;
      pBVar12->idx = iVar11;
      pBVar12->src = BVar6;
      pBVar1->val = dVar4;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar9 = end - 2;
    }
  }
  if ((int)(uVar9 - start2) < size * 2) {
    SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (keys,uVar9 + 1,compare,start2,!type);
    if (size <= (int)(uVar14 - start2)) {
      return uVar14 - 1;
    }
    size = (start2 + size) - uVar14;
    start2 = uVar14;
  }
  else {
    end = uVar9 + 1;
  }
  iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                     (keys,compare,start,end,size,start2,end2,!type);
  return iVar11;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}